

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_forward.h
# Opt level: O2

void __thiscall
shift_window_transformer::FeedForward<float>::forward
          (FeedForward<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  pointer pfVar1;
  pointer pfVar2;
  Tensor<float> tmp1;
  Tensor<float> tmp2;
  float local_9c;
  Tensor<float> local_98;
  undefined1 local_68 [24];
  pointer piStack_50;
  pointer local_48;
  pointer piStack_40;
  
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (int *)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (int *)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (float *)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (float *)0x0;
  (**(this->linear1->super_Layer<float>)._vptr_Layer)();
  local_48 = (pointer)0x0;
  piStack_40 = (pointer)0x0;
  local_68._16_8_ = (pointer)0x0;
  piStack_50 = (pointer)0x0;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&piStack_50,(const_iterator)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pfVar1 = local_98.super_vector<float,_std::allocator<float>_>.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pfVar2 = local_98.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start; pfVar2 != pfVar1; pfVar2 = pfVar2 + 1) {
    local_9c = GELU<float>(*pfVar2);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)local_68,&local_9c);
  }
  (**(this->linear2->super_Layer<float>)._vptr_Layer)(this->linear2,local_68,output);
  Tensor<float>::~Tensor((Tensor<float> *)local_68);
  Tensor<float>::~Tensor(&local_98);
  return;
}

Assistant:

void forward(const Tensor <T> &input, Tensor <T> &output) {
            Tensor<T> tmp1{};
            linear1->forward(input, tmp1);
            Tensor<T> tmp2{};
            tmp2.shape.insert(tmp2.shape.end(), tmp1.shape.begin(), tmp1.shape.end());
            for (auto item: tmp1) {
                tmp2.push_back(GELU(item));
            }
            linear2->forward(tmp2, output);
        }